

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O0

void read1_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int i;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  if (tcp == (uv_stream_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,0x81,"tcp","!=","NULL",0,"!=",0);
    abort();
  }
  if (nread < 0) {
    if (nread != -0xfff) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
              ,0x87,"nread","==","UV_EOF",nread,"==",0xfffffffffffff001);
      abort();
    }
    printf("GOT EOF\n");
    uv_close((uv_handle_t *)tcp,close_cb);
  }
  else {
    for (eval_a._4_4_ = 0; eval_a._4_4_ < nread; eval_a._4_4_ = eval_a._4_4_ + 1) {
      if ((long)buf->base[eval_a._4_4_] != 0x50) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
                ,0x85,"buf->base[i]","==","\'P\'",(long)buf->base[eval_a._4_4_],"==",0x50);
        abort();
      }
    }
  }
  return;
}

Assistant:

static void read1_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  int i;
  ASSERT_NOT_NULL(tcp);

  if (nread >= 0) {
    for (i = 0; i < nread; ++i)
      ASSERT_EQ(buf->base[i], 'P');
  } else {
    ASSERT_EQ(nread, UV_EOF);
    printf("GOT EOF\n");
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}